

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void AES_encrypt(uchar *in,uchar *out,AES_KEY *key)

{
  AES_state *in_RCX;
  long in_FS_OFFSET;
  int round;
  AES_state s;
  int in_stack_000000c4;
  AES_state *in_stack_000000c8;
  AES_state *in_stack_ffffffffffffffb8;
  AES_state *s_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar1;
  undefined1 local_18 [12];
  int in_stack_fffffffffffffff4;
  AES_state *s_01;
  
  s_01 = *(AES_state **)(in_FS_OFFSET + 0x28);
  memset(local_18,0,0x10);
  LoadBytes(in_RCX,(uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  AddRoundKey(in_RCX,(AES_state *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (iVar1 = 1; iVar1 < (int)out; iVar1 = iVar1 + 1) {
    SubBytes(in_stack_000000c8,in_stack_000000c4);
    ShiftRows(in_stack_ffffffffffffffb8);
    MixColumns(s_01,in_stack_fffffffffffffff4);
    AddRoundKey(in_RCX,(AES_state *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  }
  s_00 = (AES_state *)local_18;
  SubBytes(in_stack_000000c8,in_stack_000000c4);
  ShiftRows(s_00);
  AddRoundKey(in_RCX,(AES_state *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  SaveBytes((uchar *)in_RCX,(AES_state *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  if (*(AES_state **)(in_FS_OFFSET + 0x28) == s_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AES_encrypt(const AES_state* rounds, int nrounds, unsigned char* cipher16, const unsigned char* plain16) {
    AES_state s = {{0}};
    int round;

    LoadBytes(&s, plain16);
    AddRoundKey(&s, rounds++);

    for (round = 1; round < nrounds; round++) {
        SubBytes(&s, 0);
        ShiftRows(&s);
        MixColumns(&s, 0);
        AddRoundKey(&s, rounds++);
    }

    SubBytes(&s, 0);
    ShiftRows(&s);
    AddRoundKey(&s, rounds);

    SaveBytes(cipher16, &s);
}